

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ins_ekf::InsEkf::GetStates
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,InsEkf *this)

{
  double *pdVar1;
  iterator iVar2;
  long lVar3;
  Vector3d orientation;
  Vector3d local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QuatToRPY(&local_38,&this->orientation_);
  lVar3 = 0;
  do {
    pdVar1 = (double *)
             ((long)local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + lVar3);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,pdVar1);
    }
    else {
      *iVar2._M_current = *pdVar1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    pdVar1 = (double *)
             ((long)(this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + lVar3);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,pdVar1);
    }
    else {
      *iVar2._M_current = *pdVar1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    pdVar1 = (double *)
             ((long)(this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + lVar3);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,pdVar1);
    }
    else {
      *iVar2._M_current = *pdVar1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    pdVar1 = (double *)
             ((long)(this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + lVar3);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,pdVar1);
    }
    else {
      *iVar2._M_current = *pdVar1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    pdVar1 = (double *)
             ((long)(this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + lVar3);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,pdVar1);
    }
    else {
      *iVar2._M_current = *pdVar1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> InsEkf::GetStates() const {

        std::vector<double> states;
        Eigen::Vector3d orientation = QuatToRPY(orientation_);

        for(auto i = 0; i < 3; ++i)
            states.push_back(orientation[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(position_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(velocity_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_g_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_a_[i]);

        return states;
    }